

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

bool __thiscall OpenMesh::PolyConnectivity::is_manifold(PolyConnectivity *this,VertexHandle _vh)

{
  bool bVar1;
  value_type _heh;
  undefined1 local_38 [8];
  ConstVertexOHalfedgeIter vh_it;
  
  vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh);
  vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  bVar1 = true;
  if (vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ != -1) {
    local_38 = (undefined1  [8])this;
    vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
         vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_;
    do {
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_38);
      if (vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1) {
        return true;
      }
      if ((vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ ==
           vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) {
        return true;
      }
      _heh = Iterators::
             GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
             ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                          *)local_38);
      bVar1 = ArrayKernel::is_boundary
                        (&this->super_ArrayKernel,(HalfedgeHandle)_heh.super_BaseHandle.idx_);
    } while (!bVar1);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool PolyConnectivity::is_manifold(VertexHandle _vh) const
{
  /* The vertex is non-manifold if more than one gap exists, i.e.
    more than one outgoing boundary halfedge. If (at least) one
    boundary halfedge exists, the vertex' halfedge must be a
    boundary halfedge. If iterating around the vertex finds another
    boundary halfedge, the vertex is non-manifold. */

  ConstVertexOHalfedgeIter vh_it(*this, _vh);
  if (vh_it.is_valid())
    for (++vh_it; vh_it.is_valid(); ++vh_it)
        if (is_boundary(*vh_it))
          return false;
  return true;
}